

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void LzmaEnc_Destruct(CLzmaEnc *p,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  MatchFinder_Free(&p->matchFinderBase,allocBig);
  LzmaEnc_FreeLits(p,alloc);
  (*alloc->Free)(alloc,(p->rc).bufBase);
  (p->rc).bufBase = (Byte *)0x0;
  return;
}

Assistant:

void LzmaEnc_Destruct(CLzmaEnc *p, ISzAlloc *alloc, ISzAlloc *allocBig)
{
  #ifndef _7ZIP_ST
  MatchFinderMt_Destruct(&p->matchFinderMt, allocBig);
  #endif
  
  MatchFinder_Free(&p->matchFinderBase, allocBig);
  LzmaEnc_FreeLits(p, alloc);
  RangeEnc_Free(&p->rc, alloc);
}